

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O3

bool __thiscall slang::ast::CoverageOptionSetter::isTypeOption(CoverageOptionSetter *this)

{
  CoverageOptionSyntax *pCVar1;
  SyntaxNode *pSVar2;
  BinaryExpressionSyntax *pBVar3;
  ScopedNameSyntax *pSVar4;
  IdentifierNameSyntax *pIVar5;
  char *func;
  string_view sVar6;
  
  pCVar1 = (this->syntax).ptr;
  if (pCVar1 == (CoverageOptionSyntax *)0x0) {
    func = 
    "T slang::not_null<const slang::syntax::CoverageOptionSyntax *>::get() const [T = const slang::syntax::CoverageOptionSyntax *]"
    ;
  }
  else {
    pSVar2 = &((pCVar1->expr).ptr)->super_SyntaxNode;
    if (pSVar2 != (SyntaxNode *)0x0) {
      if (pSVar2->kind != AssignmentExpression) {
        return false;
      }
      pBVar3 = slang::syntax::SyntaxNode::as<slang::syntax::BinaryExpressionSyntax>(pSVar2);
      pSVar2 = &((pBVar3->left).ptr)->super_SyntaxNode;
      if (pSVar2 != (SyntaxNode *)0x0) {
        if (pSVar2->kind != ScopedName) {
          return false;
        }
        pSVar4 = slang::syntax::SyntaxNode::as<slang::syntax::ScopedNameSyntax>(pSVar2);
        pSVar2 = (SyntaxNode *)(pSVar4->left).ptr;
        if (pSVar2 != (SyntaxNode *)0x0) {
          if (pSVar2->kind != IdentifierName) {
            return false;
          }
          pIVar5 = slang::syntax::SyntaxNode::as<slang::syntax::IdentifierNameSyntax>(pSVar2);
          sVar6 = parsing::Token::valueText(&pIVar5->identifier);
          if (sVar6._M_len != 0xb) {
            return false;
          }
          return *(long *)((long)sVar6._M_str + 3) == 0x6e6f6974706f5f65 &&
                 *(long *)sVar6._M_str == 0x74706f5f65707974;
        }
        func = 
        "T slang::not_null<slang::syntax::NameSyntax *>::get() const [T = slang::syntax::NameSyntax *]"
        ;
        goto LAB_003d9476;
      }
    }
    func = 
    "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
    ;
  }
LAB_003d9476:
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

bool CoverageOptionSetter::isTypeOption() const {
    if (syntax->expr->kind == SyntaxKind::AssignmentExpression) {
        auto& assign = syntax->expr->as<BinaryExpressionSyntax>();
        if (assign.left->kind == SyntaxKind::ScopedName) {
            auto& scoped = assign.left->as<ScopedNameSyntax>();
            if (scoped.left->kind == SyntaxKind::IdentifierName) {
                return scoped.left->as<IdentifierNameSyntax>().identifier.valueText() ==
                       "type_option"sv;
            }
        }
    }
    return false;
}